

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O0

void __thiscall StreamReplacer::StreamReplacer(StreamReplacer *this,QPDF *pdf)

{
  QPDF *pdf_local;
  StreamReplacer *this_local;
  
  QPDFObjectHandle::StreamDataProvider::StreamDataProvider(&this->super_StreamDataProvider,false);
  *(undefined ***)this = &PTR__StreamReplacer_00117af0;
  this->pdf = pdf;
  std::
  map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
  ::map(&this->copied_streams);
  std::
  map<QPDFObjGen,_unsigned_char,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_unsigned_char>_>_>
  ::map(&this->keys);
  return;
}

Assistant:

StreamReplacer::StreamReplacer(QPDF* pdf) :
    pdf(pdf)
{
}